

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printSolutionStatistics
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,ostream *os)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string sStack_f8;
  string local_d8;
  Rational maxviol;
  Rational sumviol;
  
  lVar1 = *(long *)os;
  *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 8) = 8;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(os + lVar1 + 0x18) = *(uint *)(os + lVar1 + 0x18) & 0xfffffefb | 0x100;
  if (this->_lastSolveMode == 2) {
    poVar4 = std::operator<<(os,"Solution (rational) : \n");
    poVar4 = std::operator<<(poVar4,"  Objective value   : ");
    objValueRational(&maxviol,this);
    poVar4 = boost::multiprecision::operator<<(poVar4,&maxviol);
    std::operator<<(poVar4,"\n");
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&maxviol);
    poVar4 = std::operator<<(os,"Size (base 2/10)    : \n");
    poVar4 = std::operator<<(poVar4,"  Total primal      : ");
    iVar3 = totalSizePrimalRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = totalSizePrimalRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  Total dual        : ");
    iVar3 = totalSizeDualRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = totalSizeDualRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  DLCM primal       : ");
    iVar3 = dlcmSizePrimalRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = dlcmSizePrimalRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  DLCM dual         : ");
    iVar3 = dlcmSizeDualRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = dlcmSizeDualRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  DMAX primal       : ");
    iVar3 = dmaxSizePrimalRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = dmaxSizePrimalRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"  DMAX dual         : ");
    iVar3 = dmaxSizeDualRational(this,2);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    poVar4 = std::operator<<(poVar4," / ");
    iVar3 = dmaxSizeDualRational(this,10);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar3);
    pcVar5 = "\n";
  }
  else if (this->_lastSolveMode == 0) {
    poVar4 = std::operator<<(os,"Solution (real)     : \n");
    poVar4 = std::operator<<(poVar4,"  Objective value   : ");
    objValueReal((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)&maxviol,this);
    poVar4 = boost::multiprecision::operator<<
                       (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&maxviol);
    pcVar5 = "\n";
  }
  else {
    poVar4 = std::operator<<(os,"Solution            : \n");
    pcVar5 = "  Objective value   : -\n";
  }
  std::operator<<(poVar4,pcVar5);
  iVar3 = this->_currentSettings->_intParamValues[0x12];
  if ((iVar3 == 2) || ((iVar3 == 1 && (this->_currentSettings->_intParamValues[0x10] == 1)))) {
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._0_5_ = 1;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._5_3_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._0_5_ = 1;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._5_3_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    std::operator<<(os,"Violation (rational): \n");
    bVar2 = getBoundViolationRational(this,&maxviol,&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum bound     : ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_d8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&maxviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4," / ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&sStack_f8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&sumviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&sStack_f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator<<(os,"  Max/sum bound     : - / -\n");
    }
    bVar2 = getRowViolationRational(this,&maxviol,&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum row       : ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_d8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&maxviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4," / ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&sStack_f8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&sumviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&sStack_f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator<<(os,"  Max/sum row       : - / -\n");
    }
    bVar2 = getRedCostViolationRational(this,&maxviol,&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum redcost   : ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_d8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&maxviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4," / ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&sStack_f8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&sumviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&sStack_f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator<<(os,"  Max/sum redcost   : - / -\n");
    }
    bVar2 = getDualViolationRational(this,&maxviol,&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum dual      : ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&local_d8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&maxviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&local_d8);
      poVar4 = std::operator<<(poVar4," / ");
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::str_abi_cxx11_(&sStack_f8,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                        *)&sumviol,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
      poVar4 = std::operator<<(poVar4,(string *)&sStack_f8);
      std::operator<<(poVar4,"\n");
      std::__cxx11::string::~string((string *)&sStack_f8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator<<(os,"  Max/sum dual      : - / -\n");
    }
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&sumviol);
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&maxviol);
  }
  else {
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = true;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_5_ = 0;
    maxviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._29_3_ = 0;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._0_5_ = 0;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._5_3_ = 0;
    maxviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[1]._0_5_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = true;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.ld.data = (limb_pointer)0x0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._23_1_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._24_5_ = 0;
    sumviol.m_backend.m_value.num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ._29_3_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._0_5_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0]._5_3_ = 0;
    sumviol.m_backend.m_value.den.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[1]._0_5_ = 0;
    std::operator<<(os,"Violations (real)   : \n");
    bVar2 = getBoundViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&maxviol,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum bound     : ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&maxviol);
      poVar4 = std::operator<<(poVar4," / ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&sumviol);
      pcVar5 = "\n";
    }
    else {
      pcVar5 = "  Max/sum bound     : - / -\n";
      poVar4 = os;
    }
    std::operator<<(poVar4,pcVar5);
    bVar2 = getRowViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&maxviol,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum row       : ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&maxviol);
      poVar4 = std::operator<<(poVar4," / ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&sumviol);
      pcVar5 = "\n";
    }
    else {
      pcVar5 = "  Max/sum row       : - / -\n";
      poVar4 = os;
    }
    std::operator<<(poVar4,pcVar5);
    bVar2 = getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                      *)&maxviol,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum redcost   : ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&maxviol);
      poVar4 = std::operator<<(poVar4," / ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&sumviol);
      pcVar5 = "\n";
    }
    else {
      pcVar5 = "  Max/sum redcost   : - / -\n";
      poVar4 = os;
    }
    std::operator<<(poVar4,pcVar5);
    bVar2 = getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&maxviol,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&sumviol);
    if (bVar2) {
      poVar4 = std::operator<<(os,"  Max/sum dual      : ");
      poVar4 = boost::multiprecision::operator<<
                         (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&maxviol);
      poVar4 = std::operator<<(poVar4," / ");
      os = boost::multiprecision::operator<<
                     (poVar4,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&sumviol);
      pcVar5 = "\n";
    }
    else {
      pcVar5 = "  Max/sum dual      : - / -\n";
    }
    std::operator<<(os,pcVar5);
  }
  return;
}

Assistant:

void SoPlexBase<R>::printSolutionStatistics(std::ostream& os)
{
   SPxOut::setScientific(os);

   if(_lastSolveMode == SOLVEMODE_REAL)
   {
      os << "Solution (real)     : \n"
         << "  Objective value   : " << objValueReal() << "\n";
   }
   else if(_lastSolveMode == SOLVEMODE_RATIONAL)
   {
      os << "Solution (rational) : \n"
         << "  Objective value   : " << objValueRational() << "\n";
      os << "Size (base 2/10)    : \n"
         << "  Total primal      : " << totalSizePrimalRational() << " / " << totalSizePrimalRational(
            10) << "\n"
         << "  Total dual        : " << totalSizeDualRational() << " / " << totalSizeDualRational(10) << "\n"
         << "  DLCM primal       : " << dlcmSizePrimalRational() << " / " << dlcmSizePrimalRational(
            10) << "\n"
         << "  DLCM dual         : " << dlcmSizeDualRational() << " / " << dlcmSizeDualRational(10) << "\n"
         << "  DMAX primal       : " << dmaxSizePrimalRational() << " / " << dmaxSizePrimalRational(
            10) << "\n"
         << "  DMAX dual         : " << dmaxSizeDualRational() << " / " << dmaxSizeDualRational(10) << "\n";
   }
   else
   {
      os << "Solution            : \n"
         << "  Objective value   : -\n";
   }

   if(intParam(CHECKMODE) == CHECKMODE_RATIONAL
         || (intParam(CHECKMODE) == CHECKMODE_AUTO && intParam(READMODE) == READMODE_RATIONAL))
   {
      Rational maxviol;
      Rational sumviol;

      os << "Violation (rational): \n";

      if(getBoundViolationRational(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolationRational(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolationRational(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolationRational(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol.str() << " / " << sumviol.str() << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
   else
   {
      R maxviol;
      R sumviol;

      os << "Violations (real)   : \n";

      if(getBoundViolation(maxviol, sumviol))
         os << "  Max/sum bound     : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum bound     : - / -\n";

      if(getRowViolation(maxviol, sumviol))
         os << "  Max/sum row       : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum row       : - / -\n";

      if(getRedCostViolation(maxviol, sumviol))
         os << "  Max/sum redcost   : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum redcost   : - / -\n";

      if(getDualViolation(maxviol, sumviol))
         os << "  Max/sum dual      : " << maxviol << " / " << sumviol << "\n";
      else
         os << "  Max/sum dual      : - / -\n";
   }
}